

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O1

int ffgtnm(fitsfile *gfptr,long *nmembers,int *status)

{
  int iVar1;
  int iVar2;
  char keyvalue [71];
  char comment [73];
  char acStack_c8 [80];
  char local_78 [88];
  
  if (*status != 0) {
    return *status;
  }
  iVar1 = ffgkey(gfptr,"EXTNAME",acStack_c8,local_78,status);
  *status = iVar1;
  iVar2 = 0x154;
  if (iVar1 != 0xca) {
    prepare_keyvalue(acStack_c8);
    iVar1 = fits_strcasecmp(acStack_c8,"GROUPING");
    if (iVar1 != 0) {
      *status = 0x154;
      ffpmsg("Specified HDU is not a Grouping table (ffgtnm)");
    }
    iVar2 = ffgkyj(gfptr,"NAXIS2",nmembers,local_78,status);
  }
  *status = iVar2;
  return iVar2;
}

Assistant:

int ffgtnm(fitsfile *gfptr,    /* FITS file pointer to grouping table        */
	   long     *nmembers, /* member count  of the groping table         */
	   int      *status)   /* return status code                         */

/*
  return the number of member HDUs in a grouping table. The fitsfile pointer
  gfptr must be positioned with the grouping table as the CHDU. The number
  of grouping table member HDUs is just the NAXIS2 value of the grouping
  table.
*/

{
  char keyvalue[FLEN_VALUE];
  char comment[FLEN_COMMENT];
  

  if(*status != 0) return(*status);

  *status = fits_read_keyword(gfptr,"EXTNAME",keyvalue,comment,status);
  
  if(*status == KEY_NO_EXIST)
    *status = NOT_GROUP_TABLE;
  else
    {
      prepare_keyvalue(keyvalue);

      if(fits_strcasecmp(keyvalue,"GROUPING") != 0)
	{
	  *status = NOT_GROUP_TABLE;
	  ffpmsg("Specified HDU is not a Grouping table (ffgtnm)");
	}

      *status = fits_read_key_lng(gfptr,"NAXIS2",nmembers,comment,status);
    }

  return(*status);
}